

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_zero(void *ptr,nk_size size)

{
  nk_size nVar1;
  ulong uVar2;
  
  if (ptr == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x18db,"void nk_zero(void *, nk_size)");
  }
  if (size < 0xc) {
    for (nVar1 = 0; size != nVar1; nVar1 = nVar1 + 1) {
      *(undefined1 *)((long)ptr + nVar1) = 0;
    }
  }
  else {
    uVar2 = (ulong)ptr & 3;
    if (uVar2 != 0) {
      memset(ptr,0,4 - uVar2);
      size = size - (4 - uVar2);
      ptr = (void *)((long)ptr + (4 - uVar2));
    }
    memset(ptr,0,size & 0xfffffffffffffffc);
    if ((size & 3) != 0) {
      memset((void *)((long)ptr + (size & 0xfffffffffffffffc)),0,size & 3);
      return;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_zero(void *ptr, nk_size size)
{
    NK_ASSERT(ptr);
    NK_MEMSET(ptr, 0, size);
}